

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdef.c
# Opt level: O0

void cdef_prepare_fb(AV1_COMMON *cm,CdefBlockInfo *fb_info,uint16_t **colbuf,int cdef_left,int fbc,
                    int fbr,int plane)

{
  uint16_t *dst;
  uint uVar1;
  int iVar2;
  int iVar3;
  int h;
  int src_hoffset;
  int iVar4;
  int sstride;
  int in_ECX;
  long in_RDX;
  undefined8 *in_RSI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  int in_stack_00000008;
  int stride;
  int bot_offset;
  uint16_t *bot_linebuf;
  uint16_t *top_linebuf;
  int vsize;
  int hsize;
  int nvb;
  int nhb;
  int cend;
  int rend;
  int cstart;
  int nhfb;
  int nvfb;
  int luma_stride;
  uint16_t *src;
  CommonModeInfoParams *mi_params;
  int in_stack_ffffffffffffff64;
  undefined4 in_stack_ffffffffffffff6c;
  int in_stack_ffffffffffffff74;
  undefined4 uVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  int local_50;
  int local_4c;
  int local_48;
  
  dst = (uint16_t *)*in_RSI;
  uVar1 = *(int *)(in_RDI + 0x218) * 4 + 0xf;
  iVar2 = (*(int *)(in_RDI + 0x214) + 0xf) / 0x10;
  iVar3 = (*(int *)(in_RDI + 0x218) + 0xf) / 0x10;
  local_48 = 0;
  if (in_ECX == 0) {
    local_48 = -8;
  }
  if (*(int *)(in_RDI + 0x218) + in_R8D * -0x10 < 0x11) {
    iVar7 = *(int *)(in_RDI + 0x218) + in_R8D * -0x10;
  }
  else {
    iVar7 = 0x10;
  }
  if (*(int *)(in_RDI + 0x214) + in_R9D * -0x10 < 0x11) {
    iVar6 = *(int *)(in_RDI + 0x214) + in_R9D * -0x10;
  }
  else {
    iVar6 = 0x10;
  }
  h = iVar7 << ((byte)*(undefined4 *)(in_RSI + 0x49) & 0x1f);
  src_hoffset = iVar6 << ((byte)*(undefined4 *)((long)in_RSI + 0x24c) & 0x1f);
  lVar9 = in_RSI[(long)in_stack_00000008 + 1];
  lVar8 = in_RSI[(long)in_stack_00000008 + 4];
  iVar4 = (src_hoffset + 2) * 0x90;
  if (in_stack_00000008 == 0) {
    uVar5 = 0;
  }
  else {
    uVar5 = *(undefined4 *)(*(long *)(in_RDI + 0x6088) + 0x60);
  }
  sstride = (int)(uVar1 & 0xfffffff0) >> ((byte)uVar5 & 0x1f);
  local_50 = h;
  if (in_R8D != iVar3 + -1) {
    local_50 = h + 8;
  }
  local_4c = src_hoffset;
  if (in_R9D != iVar2 + -1) {
    local_4c = src_hoffset + 2;
  }
  av1_cdef_copy_sb8_16
            ((AV1_COMMON *)CONCAT44(iVar7,iVar6),
             (uint16_t *)(CONCAT44(uVar1,uVar5) & 0xfffffff0ffffffff),in_stack_ffffffffffffff74,
             (uint8_t *)CONCAT44(in_stack_ffffffffffffff6c,local_50 - local_48),
             in_stack_ffffffffffffff64,src_hoffset,(int)lVar8,(int)lVar9,src_hoffset);
  if (in_R9D < iVar2 + -1) {
    copy_rect(dst + (iVar4 + 8),0x90,(uint16_t *)(lVar8 + (long)*(int *)(in_RSI + 0x14f) * 2),
              sstride,2,h);
  }
  else {
    fill_rect(dst + (iVar4 + 8),0x90,2,h,0x4000);
  }
  if ((in_R9D < iVar2 + -1) && (0 < in_R8D)) {
    copy_rect(dst + iVar4,0x90,(uint16_t *)(lVar8 + (long)(*(int *)(in_RSI + 0x14f) + -8) * 2),
              sstride,2,8);
  }
  else {
    fill_rect(dst + iVar4,0x90,2,8,0x4000);
  }
  if ((in_R9D < iVar2 + -1) && (in_R8D < iVar3 + -1)) {
    copy_rect(dst + (iVar4 + h + 8),0x90,
              (uint16_t *)(lVar8 + (long)(*(int *)(in_RSI + 0x14f) + h) * 2),sstride,2,8);
  }
  else {
    fill_rect(dst + (iVar4 + h + 8),0x90,2,8,0x4000);
  }
  if (in_R9D < 1) {
    fill_rect(dst + 8,0x90,2,h,0x4000);
  }
  else {
    copy_rect(dst + 8,0x90,(uint16_t *)(lVar9 + (long)*(int *)(in_RSI + 0x14f) * 2),sstride,2,h);
    if (0 < in_R8D) {
      copy_rect(dst,0x90,(uint16_t *)(lVar9 + (long)(*(int *)(in_RSI + 0x14f) + -8) * 2),sstride,2,8
               );
      goto LAB_0048abe1;
    }
  }
  fill_rect(dst,0x90,2,8,0x4000);
LAB_0048abe1:
  if ((in_R9D < 1) || (iVar3 + -1 <= in_R8D)) {
    fill_rect(dst + (h + 8),0x90,2,8,0x4000);
  }
  else {
    copy_rect(dst + (h + 8),0x90,(uint16_t *)(lVar9 + (long)(*(int *)(in_RSI + 0x14f) + h) * 2),
              sstride,2,8);
  }
  if (in_ECX != 0) {
    copy_rect(dst,0x90,*(uint16_t **)(in_RDX + (long)in_stack_00000008 * 8),8,local_4c + 2,8);
  }
  copy_rect(*(uint16_t **)(in_RDX + (long)in_stack_00000008 * 8),8,dst + h,0x90,local_4c + 2,8);
  if (*(int *)((long)in_RSI + 0x254) != 0) {
    fill_rect(dst,0x90,src_hoffset + 4,8,0x4000);
  }
  if (*(int *)((long)in_RSI + 0x25c) != 0) {
    fill_rect(dst + (h + 8),0x90,src_hoffset + 4,8,0x4000);
  }
  return;
}

Assistant:

static void cdef_prepare_fb(const AV1_COMMON *const cm, CdefBlockInfo *fb_info,
                            uint16_t **const colbuf, const int cdef_left,
                            int fbc, int fbr, int plane) {
  const CommonModeInfoParams *const mi_params = &cm->mi_params;
  uint16_t *src = fb_info->src;
  const int luma_stride =
      ALIGN_POWER_OF_TWO(mi_params->mi_cols << MI_SIZE_LOG2, 4);
  const int nvfb = (mi_params->mi_rows + MI_SIZE_64X64 - 1) / MI_SIZE_64X64;
  const int nhfb = (mi_params->mi_cols + MI_SIZE_64X64 - 1) / MI_SIZE_64X64;
  int cstart = 0;
  if (!cdef_left) cstart = -CDEF_HBORDER;
  int rend, cend;
  const int nhb =
      AOMMIN(MI_SIZE_64X64, mi_params->mi_cols - MI_SIZE_64X64 * fbc);
  const int nvb =
      AOMMIN(MI_SIZE_64X64, mi_params->mi_rows - MI_SIZE_64X64 * fbr);
  const int hsize = nhb << fb_info->mi_wide_l2;
  const int vsize = nvb << fb_info->mi_high_l2;
  const uint16_t *top_linebuf = fb_info->top_linebuf[plane];
  const uint16_t *bot_linebuf = fb_info->bot_linebuf[plane];
  const int bot_offset = (vsize + CDEF_VBORDER) * CDEF_BSTRIDE;
  const int stride =
      luma_stride >> (plane == AOM_PLANE_Y ? 0 : cm->seq_params->subsampling_x);

  if (fbc == nhfb - 1)
    cend = hsize;
  else
    cend = hsize + CDEF_HBORDER;

  if (fbr == nvfb - 1)
    rend = vsize;
  else
    rend = vsize + CDEF_VBORDER;

  /* Copy in the pixels we need from the current superblock for
  deringing.*/
  av1_cdef_copy_sb8_16(
      cm, &src[CDEF_VBORDER * CDEF_BSTRIDE + CDEF_HBORDER + cstart],
      CDEF_BSTRIDE, fb_info->dst, fb_info->roffset, fb_info->coffset + cstart,
      fb_info->dst_stride, vsize, cend - cstart);

  /* Copy in the pixels we need for the current superblock from bottom buffer.*/
  if (fbr < nvfb - 1) {
    copy_rect(&src[bot_offset + CDEF_HBORDER], CDEF_BSTRIDE,
              &bot_linebuf[fb_info->coffset], stride, CDEF_VBORDER, hsize);
  } else {
    fill_rect(&src[bot_offset + CDEF_HBORDER], CDEF_BSTRIDE, CDEF_VBORDER,
              hsize, CDEF_VERY_LARGE);
  }
  if (fbr < nvfb - 1 && fbc > 0) {
    copy_rect(&src[bot_offset], CDEF_BSTRIDE,
              &bot_linebuf[fb_info->coffset - CDEF_HBORDER], stride,
              CDEF_VBORDER, CDEF_HBORDER);
  } else {
    fill_rect(&src[bot_offset], CDEF_BSTRIDE, CDEF_VBORDER, CDEF_HBORDER,
              CDEF_VERY_LARGE);
  }
  if (fbr < nvfb - 1 && fbc < nhfb - 1) {
    copy_rect(&src[bot_offset + hsize + CDEF_HBORDER], CDEF_BSTRIDE,
              &bot_linebuf[fb_info->coffset + hsize], stride, CDEF_VBORDER,
              CDEF_HBORDER);
  } else {
    fill_rect(&src[bot_offset + hsize + CDEF_HBORDER], CDEF_BSTRIDE,
              CDEF_VBORDER, CDEF_HBORDER, CDEF_VERY_LARGE);
  }

  /* Copy in the pixels we need from the current superblock from top buffer.*/
  if (fbr > 0) {
    copy_rect(&src[CDEF_HBORDER], CDEF_BSTRIDE, &top_linebuf[fb_info->coffset],
              stride, CDEF_VBORDER, hsize);
  } else {
    fill_rect(&src[CDEF_HBORDER], CDEF_BSTRIDE, CDEF_VBORDER, hsize,
              CDEF_VERY_LARGE);
  }
  if (fbr > 0 && fbc > 0) {
    copy_rect(src, CDEF_BSTRIDE, &top_linebuf[fb_info->coffset - CDEF_HBORDER],
              stride, CDEF_VBORDER, CDEF_HBORDER);
  } else {
    fill_rect(src, CDEF_BSTRIDE, CDEF_VBORDER, CDEF_HBORDER, CDEF_VERY_LARGE);
  }
  if (fbr > 0 && fbc < nhfb - 1) {
    copy_rect(&src[hsize + CDEF_HBORDER], CDEF_BSTRIDE,
              &top_linebuf[fb_info->coffset + hsize], stride, CDEF_VBORDER,
              CDEF_HBORDER);
  } else {
    fill_rect(&src[hsize + CDEF_HBORDER], CDEF_BSTRIDE, CDEF_VBORDER,
              CDEF_HBORDER, CDEF_VERY_LARGE);
  }
  if (cdef_left) {
    /* If we deringed the superblock on the left then we need to copy in
    saved pixels. */
    copy_rect(src, CDEF_BSTRIDE, colbuf[plane], CDEF_HBORDER,
              rend + CDEF_VBORDER, CDEF_HBORDER);
  }
  /* Saving pixels in case we need to dering the superblock on the
  right. */
  copy_rect(colbuf[plane], CDEF_HBORDER, src + hsize, CDEF_BSTRIDE,
            rend + CDEF_VBORDER, CDEF_HBORDER);

  if (fb_info->frame_boundary[LEFT]) {
    fill_rect(src, CDEF_BSTRIDE, vsize + 2 * CDEF_VBORDER, CDEF_HBORDER,
              CDEF_VERY_LARGE);
  }
  if (fb_info->frame_boundary[RIGHT]) {
    fill_rect(&src[hsize + CDEF_HBORDER], CDEF_BSTRIDE,
              vsize + 2 * CDEF_VBORDER, CDEF_HBORDER, CDEF_VERY_LARGE);
  }
}